

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

void __thiscall wabt::WastLexer::ReadWhitespace(WastLexer *this)

{
  int iVar1;
  WastLexer *this_local;
  
  do {
    iVar1 = PeekChar(this);
    switch(iVar1) {
    case 9:
    case 0xd:
    case 0x20:
      ReadChar(this);
      break;
    case 10:
      ReadChar(this);
      Newline(this);
      break;
    default:
      return;
    }
  } while( true );
}

Assistant:

void WastLexer::ReadWhitespace() {
  while (true) {
    switch (PeekChar()) {
      case ' ':
      case '\t':
      case '\r':
        ReadChar();
        break;

      case '\n':
        ReadChar();
        Newline();
        break;

      default:
        return;
    }
  }
}